

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIncludeCommand.h
# Opt level: O0

cmCommand * __thiscall cmIncludeCommand::Clone(cmIncludeCommand *this)

{
  cmCommand *this_00;
  cmIncludeCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x50);
  cmIncludeCommand((cmIncludeCommand *)this_00);
  return this_00;
}

Assistant:

virtual cmCommand* Clone()
    {
    return new cmIncludeCommand;
    }